

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void __thiscall cubeb_individual_methods_Test::TestBody(cubeb_individual_methods_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8e0;
  AssertionResult gtest_ar_1;
  uint32_t frames_needed2;
  uint32_t frames_needed1;
  AssertHelper local_8c0;
  cubeb_resampler_speex_one_way<float> one_way;
  delay_line<float> dl;
  float buffer [512];
  
  delay_line<float>::delay_line(&dl,10,2,0xac44);
  frames_needed1 = 0;
  one_way._vptr_cubeb_resampler_speex_one_way._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)buffer,"frames_needed1","0u",&frames_needed1,(uint *)&one_way);
  if (buffer[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&one_way);
    if (buffer._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)buffer._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x434,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&one_way);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&one_way);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(buffer + 2));
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(buffer + 2));
    cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way(&one_way,2,0xac44,0xac44,1);
    memset(buffer,0,0x800);
    cubeb_resampler_speex_one_way<float>::input(&one_way,buffer,0x100);
    frames_needed2 = cubeb_resampler_speex_one_way<float>::input_needed_for_output(&one_way,0);
    local_8e0.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar_1,"frames_needed2","0u",&frames_needed2,(uint *)&local_8e0);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_8e0);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_8c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x43c,pcVar1);
      testing::internal::AssertHelper::operator=(&local_8c0,(Message *)&local_8e0);
      testing::internal::AssertHelper::~AssertHelper(&local_8c0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_8e0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    cubeb_resampler_speex_one_way<float>::~cubeb_resampler_speex_one_way(&one_way);
  }
  delay_line<float>::~delay_line(&dl);
  return;
}

Assistant:

TEST(cubeb, individual_methods) {
  const uint32_t channels = 2;
  const uint32_t sample_rate = 44100;
  const uint32_t frames = 256;

  delay_line<float> dl(10, channels, sample_rate);
  uint32_t frames_needed1 = dl.input_needed_for_output(0);
  ASSERT_EQ(frames_needed1, 0u);

  cubeb_resampler_speex_one_way<float> one_way(channels, sample_rate, sample_rate, CUBEB_RESAMPLER_QUALITY_DEFAULT);
  float buffer[channels * frames] = {0.0};
  // Add all frames in the resampler's internal buffer.
  one_way.input(buffer, frames);
  // Ask for less than the existing frames, this would create a uint overlflow without the fix.
  uint32_t frames_needed2 = one_way.input_needed_for_output(0);
  ASSERT_EQ(frames_needed2, 0u);
}